

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_catch::translate
          (method_catch *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  _Elt_pointer pdVar2;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  statement_catch *this_00;
  _Elt_pointer pptVar6;
  internal_error *this_01;
  compile_error *this_02;
  size_t size;
  allocator local_71;
  string local_70;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  size = 1;
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar4;
  local_70._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_70);
  if (*pptVar5 == (token_base *)0x0) {
    this_01 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,"Null pointer accessed.",&local_71);
    internal_error::internal_error(this_01,&local_70);
    __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_70._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_70);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 4) {
    this_00 = (statement_catch *)statement_base::operator_new((statement_base *)0x40,size);
    local_70._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_70);
    std::__cxx11::string::string((string *)&local_40,(string *)(*pptVar5 + 3));
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar6 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar6 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_catch::statement_catch(this_00,&local_40,(context_t *)&local_50,pptVar6[-1]);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__cxx11::string::~string((string *)&local_40);
    return &this_00->super_statement_base;
  }
  this_02 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_70,"Wrong grammar for catch statement, expect <id>",&local_71);
  compile_error::compile_error(this_02,&local_70);
  __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_catch::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for catch statement, expect <id>");
		return new statement_catch(static_cast<token_id *>(t.root().data())->get_id(), context, raw.front().back());
	}